

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_DetachItemFromArray(cJSON *array,int which)

{
  cJSON *local_28;
  cJSON *c;
  int which_local;
  cJSON *array_local;
  
  c._4_4_ = which;
  for (local_28 = array->child; local_28 != (cJSON *)0x0 && 0 < c._4_4_; local_28 = local_28->next)
  {
    c._4_4_ = c._4_4_ + -1;
  }
  if (local_28 == (cJSON *)0x0) {
    array_local = (cJSON *)0x0;
  }
  else {
    if (local_28->prev != (cJSON *)0x0) {
      local_28->prev->next = local_28->next;
    }
    if (local_28->next != (cJSON *)0x0) {
      local_28->next->prev = local_28->prev;
    }
    if (local_28 == array->child) {
      array->child = local_28->next;
    }
    local_28->next = (cJSON *)0x0;
    local_28->prev = (cJSON *)0x0;
    array_local = local_28;
  }
  return array_local;
}

Assistant:

cJSON *
cJSON_DetachItemFromArray(cJSON *array, int which)
{
    cJSON *c = array->child;
    while (c && which > 0)
        c = c->next, which--;
    if (!c)
        return 0;
    if (c->prev)
        c->prev->next = c->next;
    if (c->next)
        c->next->prev = c->prev;
    if (c == array->child)
        array->child = c->next;
    c->prev = c->next = 0;
    return c;
}